

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatTimeInMillisAsDuration_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [392];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::ostream::_M_insert<double>((double)(long)this * 0.001);
  std::operator<<(poVar1,"s");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string FormatTimeInMillisAsDuration(TimeInMillis ms) {
  ::std::stringstream ss;
  ss << (static_cast<double>(ms) * 1e-3) << "s";
  return ss.str();
}